

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O1

void __thiscall
nlohmann::json_schema::root_schema::insert_unknown_keyword
          (root_schema *this,json_uri *uri,string *key,json *value)

{
  json *this_00;
  value_t vVar1;
  pointer pcVar2;
  json_value jVar3;
  bool bVar4;
  schema_file *psVar5;
  iterator iVar6;
  string_t *__x;
  reference pvVar7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *ptr;
  string_type *key_00;
  reference value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  initializer_list<nlohmann::json_uri> __l;
  json_pointer uri_pointer;
  json_pointer fragment;
  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __end3;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ref_tokens;
  json_pointer rt_ptr;
  json_uri new_uri;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_300;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2f0;
  string *local_2e0;
  _Map_pointer local_2d8;
  root_schema *local_2d0;
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  key_type local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  key_type local_288;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_268;
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  undefined1 local_238 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [3];
  undefined1 local_1c8 [184];
  schema local_110;
  json_uri local_e8;
  
  local_2e0 = key;
  json_uri::location_abi_cxx11_(&local_e8.urn_,uri);
  local_2d0 = this;
  psVar5 = get_or_create_file(this,&local_e8.urn_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.urn_._M_dataplus._M_p != &local_e8.urn_.field_2) {
    operator_delete(local_e8.urn_._M_dataplus._M_p,local_e8.urn_.field_2._M_allocated_capacity + 1);
  }
  json_uri::append(&local_e8,uri,local_2e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_250.reference_tokens,&local_e8.pointer_.reference_tokens);
  json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  to_string((string_t *)local_1c8,&local_250);
  iVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
          ::find(&psVar5->unresolved,(key_type *)local_1c8);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  if ((_Rb_tree_header *)iVar6._M_node == &(psVar5->unresolved)._M_t._M_impl.super__Rb_tree_header)
  {
    local_1c8._64_8_ = (pointer)0x0;
    local_1c8._72_8_ = (_Map_pointer)0x0;
    local_1c8._48_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1c8._56_8_ = 0;
    local_1c8._32_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1c8._40_8_ = (_Map_pointer)0x0;
    local_1c8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1c8._24_8_ = 0;
    local_1c8._0_8_ = (char *)0x0;
    local_1c8._8_8_ = (_Rb_tree_node_base *)0x0;
    std::
    _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1c8,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2c8.reference_tokens,&(uri->pointer_).reference_tokens);
    while (local_2c8.reference_tokens.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_2c8.reference_tokens.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      __x = json_abi_v3_11_2::
            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::back(&local_2c8);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c8,__x);
      json_abi_v3_11_2::
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pop_back(&local_2c8);
    }
    ptr = &psVar5->unknown_keywords;
    local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_1c8._48_8_;
    if (local_1c8._16_8_ != local_1c8._48_8_) {
      local_2d8 = (_Map_pointer)local_1c8._40_8_;
      this_00 = &local_110.default_value_;
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._16_8_;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._32_8_
      ;
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238,"/",__rhs);
        json_abi_v3_11_2::
        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238._0_8_ !=
            local_228) {
          operator_delete((void *)local_238._0_8_,(ulong)((long)local_228[0]._M_dataplus._M_p + 1));
        }
        bVar4 = json_abi_v3_11_2::json_pointer<std::__cxx11::string>::
                contains<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((json_pointer<std::__cxx11::string> *)this_00,ptr);
        if (!bVar4) {
          json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json(&local_2f0,(initializer_list_t)ZEXT816(0),false,object);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          pcVar2 = (__rhs->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b0,pcVar2,pcVar2 + __rhs->_M_string_length);
          pvVar7 = json_abi_v3_11_2::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](ptr,&local_2b0);
          vVar1 = pvVar7->m_type;
          pvVar7->m_type = local_2f0.m_type;
          jVar3 = pvVar7->m_value;
          pvVar7->m_value = local_2f0.m_value;
          local_2f0.m_type = vVar1;
          local_2f0.m_value = jVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_2f0);
        }
        ptr = json_abi_v3_11_2::json_pointer<std::__cxx11::string>::
              get_unchecked<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((json_pointer<std::__cxx11::string> *)this_00,ptr);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
        __rhs = __rhs + 1;
        if (__rhs == pbVar8) {
          __rhs = local_2d8[1];
          local_2d8 = local_2d8 + 1;
          pbVar8 = __rhs + 0x10;
        }
      } while (__rhs != local_290);
    }
    json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&local_300,value);
    pcVar2 = (local_2e0->_M_dataplus)._M_p;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,pcVar2,pcVar2 + local_2e0->_M_string_length);
    pvVar7 = json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[](ptr,&local_288);
    vVar1 = pvVar7->m_type;
    pvVar7->m_type = local_300.m_type;
    jVar3 = pvVar7->m_value;
    pvVar7->m_value = local_300.m_value;
    local_300.m_type = vVar1;
    local_300.m_value = jVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_300);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8.reference_tokens);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1c8);
  }
  else {
    local_238._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_238._8_8_ = (_Base_ptr)0x0;
    local_228[0]._M_dataplus._M_p = (pointer)0x0;
    json_uri::json_uri((json_uri *)local_1c8,&local_e8);
    __l._M_len = 1;
    __l._M_array = (iterator)local_1c8;
    std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
              (&local_268,__l,(allocator_type *)&local_2c8);
    anon_unknown.dwarf_3e087::schema::make
              (&local_110,value,local_2d0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_238,&local_268);
    if (local_110.root_ != (root_schema *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110.root_);
    }
    std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_268);
    json_uri::~json_uri((json_uri *)local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
  }
  if (value->m_type == object) {
    local_2c8.reference_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)value;
    json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::begin((iterator *)local_238,value);
    json_abi_v3_11_2::detail::
    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::iteration_proxy_value
              ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_1c8,(iterator *)local_238,0);
    json_abi_v3_11_2::detail::
    iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)local_238,
          (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)&local_2c8);
    while( true ) {
      bVar4 = json_abi_v3_11_2::detail::
              iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_1c8,(iterator *)local_238);
      if (bVar4) break;
      key_00 = json_abi_v3_11_2::detail::
               iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)local_1c8);
      value_00 = json_abi_v3_11_2::detail::
                 iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_1c8);
      insert_unknown_keyword(local_2d0,&local_e8,key_00,value_00);
      if (*(char *)local_1c8._0_8_ == '\x02') {
        local_1c8._16_8_ = local_1c8._16_8_ + 0x10;
      }
      else if (*(char *)local_1c8._0_8_ == '\x01') {
        local_1c8._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_1c8._8_8_);
      }
      else {
        local_1c8._24_8_ = local_1c8._24_8_ + 1;
      }
      local_1c8._32_8_ = local_1c8._32_8_ + 1;
    }
    json_abi_v3_11_2::detail::
    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~iteration_proxy_value
              ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_238);
    json_abi_v3_11_2::detail::
    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~iteration_proxy_value
              ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_1c8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_250.reference_tokens);
  json_uri::~json_uri(&local_e8);
  return;
}

Assistant:

void insert_unknown_keyword(const json_uri &uri, const std::string &key, json &value)
	{
		auto &file = get_or_create_file(uri.location());
		auto new_uri = uri.append(key);
		auto fragment = new_uri.pointer();

		// is there a reference looking for this unknown-keyword, which is thus no longer a unknown keyword but a schema
		auto unresolved = file.unresolved.find(fragment.to_string());
		if (unresolved != file.unresolved.end())
			schema::make(value, this, {}, {{new_uri}});
		else { // no, nothing ref'd it, keep for later

			// need to create an object for each reference-token in the
			// JSON-Pointer When not existing, a stringified integer reference
			// token (e.g. "123") in the middle of the pointer will be
			// interpreted a an array-index and an array will be created.

			// json_pointer's reference_tokens is private - get them
			std::deque<std::string> ref_tokens;
			auto uri_pointer = uri.pointer();
			while (!uri_pointer.empty()) {
				ref_tokens.push_front(uri_pointer.back());
				uri_pointer.pop_back();
			}

			// for each token create an object, if not already existing
			auto unk_kw = &file.unknown_keywords;
			for (auto &rt : ref_tokens) {
				// create a json_pointer from rt as rt can be an stringified integer doing find on an array won't work
				json::json_pointer rt_ptr{"/" + rt};
				if (unk_kw->contains(rt_ptr) == false)
					(*unk_kw)[rt] = json::object();
				unk_kw = &(*unk_kw)[rt_ptr];
			}
			(*unk_kw)[key] = value;
		}

		// recursively add possible subschemas of unknown keywords
		if (value.type() == json::value_t::object)
			for (auto &subsch : value.items())
				insert_unknown_keyword(new_uri, subsch.key(), subsch.value());
	}